

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O0

Expected<Talks> * cppti::TalksLoader::loadFrom(Expected<Talks> *__return_storage_ptr__,istream *ifs)

{
  exception *e;
  undefined1 auStack_48 [8];
  Talks talks;
  undefined1 local_28 [8];
  json json;
  istream *ifs_local;
  
  json.m_value = (json_value)ifs;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_28,(nullptr_t)0x0);
  auStack_48 = (undefined1  [8])0x0;
  talks.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  talks.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::vector
            ((vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)auStack_48);
  nlohmann::operator>>
            ((istream *)json.m_value.object,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_0>
            ((vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)&e,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_28);
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::operator=
            ((vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)auStack_48,
             (vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)&e);
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector
            ((vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)&e);
  tl::expected<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>::
  expected<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_nullptr,_nullptr>
            (__return_storage_ptr__,(vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)auStack_48)
  ;
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector
            ((vector<cppti::Talk,_std::allocator<cppti::Talk>_> *)auStack_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::istream& ifs)
{
  auto json = nlohmann::json{};
  auto talks = Talks{};

  try
  {
    ifs >> json;
    talks = json.get<Talks>();
  }
  catch (nlohmann::json::exception const& e)
  {
    return tl::unexpected{ErrContext{ErrCode::DB_INVALID_FORMAT, e.what()}};
  }
  return talks;
}